

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct32x32_low16_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar33;
  int iVar34;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  undefined1 auVar35 [16];
  int iVar40;
  int iVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar45;
  int iVar50;
  int iVar51;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar52;
  int iVar53;
  int iVar55;
  int iVar56;
  undefined1 auVar54 [16];
  int iVar57;
  int iVar58;
  int iVar60;
  int iVar61;
  undefined1 auVar59 [16];
  int iVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  __m128i cospi32;
  int local_428;
  int iStack_424;
  int iStack_420;
  int iStack_41c;
  int local_418;
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  __m128i cospi16;
  __m128i cospim48;
  __m128i cospi48;
  int local_3a8;
  int iStack_3a4;
  int iStack_3a0;
  int iStack_39c;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int local_388;
  int iStack_384;
  int iStack_380;
  int iStack_37c;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int local_368;
  int iStack_364;
  int iStack_360;
  int iStack_35c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  int local_348;
  int iStack_344;
  int iStack_340;
  int iStack_33c;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int local_328;
  int iStack_324;
  int iStack_320;
  int iStack_31c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  __m128i clamp_lo;
  __m128i cospim16;
  __m128i cospim32;
  __m128i cospim24;
  __m128i cospim56;
  __m128i cospim8;
  __m128i cospi40;
  __m128i clamp_hi;
  __m128i rounding;
  __m128i cospim40;
  __m128i cospi8;
  __m128i cospi24;
  __m128i cospi56;
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint local_228;
  uint uStack_224;
  uint uStack_220;
  uint uStack_21c;
  uint local_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  uint local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint local_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint local_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint local_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint local_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  uint local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint local_108;
  uint uStack_104;
  uint uStack_100;
  uint uStack_fc;
  uint local_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  lVar4 = (long)bit * 0x100;
  iVar7 = -*(int *)((long)vert_filter_length_chroma + lVar4 + 0x248);
  iVar13 = -*(int *)((long)vert_filter_length_chroma + lVar4 + 0x208);
  iVar15 = -*(int *)((long)vert_filter_length_chroma + lVar4 + 0x228);
  iVar17 = -*(int *)((long)vert_filter_length_chroma + lVar4 + 0x1e8);
  iVar53 = -*(int *)((long)vert_filter_length_chroma + lVar4 + 0x230);
  iVar55 = -*(int *)((long)vert_filter_length_chroma + lVar4 + 0x1f0);
  cospi56[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar4 + 0x240);
  cospi24[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar4 + 0x1c0);
  cospi40[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar4 + 0x200);
  cospi8[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar4 + 0x180);
  cospim40[0]._0_4_ = -(int)cospi40[0];
  cospi16[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar4 + 0x1a0);
  cospim8[0]._0_4_ = -(int)cospi8[0];
  cospim56[0]._0_4_ = -(int)cospi56[0];
  cospim24[0]._0_4_ = -(int)cospi24[0];
  cospi32[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar4 + 0x1e0);
  cospim32[0]._0_4_ = -(int)cospi32[0];
  cospi48[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar4 + 0x220);
  cospim48[0]._0_4_ = -(int)cospi48[0];
  iVar3 = 1 << ((char)bit - 1U & 0x1f);
  cospim16[0]._0_4_ = -(int)cospi16[0];
  iVar5 = bd + (uint)(do_cols == 0) * 2;
  iVar6 = 0x8000;
  if (0xf < iVar5 + 6) {
    iVar6 = 1 << ((char)iVar5 + 5U & 0x1f);
  }
  iVar5 = -iVar6;
  iVar6 = iVar6 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 600);
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1d8);
  auVar64._4_4_ = uVar1;
  auVar64._0_4_ = uVar1;
  auVar64._8_4_ = uVar1;
  auVar64._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x218);
  auVar72._4_4_ = uVar1;
  auVar72._0_4_ = uVar1;
  auVar72._8_4_ = uVar1;
  auVar72._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x198);
  auVar46._4_4_ = uVar1;
  auVar46._0_4_ = uVar1;
  auVar46._8_4_ = uVar1;
  auVar46._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x238);
  auVar68._4_4_ = uVar1;
  auVar68._0_4_ = uVar1;
  auVar68._8_4_ = uVar1;
  auVar68._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1b8);
  auVar63._4_4_ = uVar1;
  auVar63._0_4_ = uVar1;
  auVar63._8_4_ = uVar1;
  auVar63._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1f8);
  auVar67._4_4_ = uVar1;
  auVar67._0_4_ = uVar1;
  auVar67._8_4_ = uVar1;
  auVar67._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x188);
  auVar71._4_4_ = uVar1;
  auVar71._0_4_ = uVar1;
  auVar71._8_4_ = uVar1;
  auVar71._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1a8);
  auVar42._4_4_ = uVar1;
  auVar42._0_4_ = uVar1;
  auVar42._8_4_ = uVar1;
  auVar42._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x168);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  auVar44._4_4_ = iVar13;
  auVar44._0_4_ = iVar13;
  auVar44._8_4_ = iVar13;
  auVar44._12_4_ = iVar13;
  auVar47._4_4_ = iVar15;
  auVar47._0_4_ = iVar15;
  auVar47._8_4_ = iVar15;
  auVar47._12_4_ = iVar15;
  auVar59._4_4_ = iVar17;
  auVar59._0_4_ = iVar17;
  auVar59._8_4_ = iVar17;
  auVar59._12_4_ = iVar17;
  local_238 = (uint)(*in)[0];
  uStack_234 = (uint)((ulong)(*in)[0] >> 0x20);
  uStack_230 = (uint)(*in)[1];
  uStack_22c = (uint)((ulong)(*in)[1] >> 0x20);
  local_218 = (uint)in[8][0];
  uStack_214 = (uint)((ulong)in[8][0] >> 0x20);
  uStack_210 = (uint)in[8][1];
  uStack_20c = (uint)((ulong)in[8][1] >> 0x20);
  uStack_1ec = (uint)((ulong)in[4][1] >> 0x20);
  uStack_1cc = (uint)((ulong)in[0xc][1] >> 0x20);
  uStack_1ac = (uint)((ulong)in[2][1] >> 0x20);
  uStack_18c = (uint)((ulong)in[10][1] >> 0x20);
  uStack_16c = (uint)((ulong)in[6][1] >> 0x20);
  uStack_14c = (uint)((ulong)in[0xe][1] >> 0x20);
  auVar20 = pmulld(auVar35,(undefined1  [16])in[1]);
  auVar54 = pmulld(auVar54,(undefined1  [16])in[1]);
  auVar59 = pmulld(auVar59,(undefined1  [16])in[0xf]);
  auVar30 = pmulld(auVar64,(undefined1  [16])in[0xf]);
  auVar22 = pmulld(auVar42,(undefined1  [16])in[9]);
  auVar42 = pmulld(auVar72,(undefined1  [16])in[9]);
  auVar29 = pmulld(auVar47,(undefined1  [16])in[7]);
  auVar47 = pmulld(auVar46,(undefined1  [16])in[7]);
  auVar72 = pmulld(auVar71,(undefined1  [16])in[5]);
  auVar35 = pmulld(auVar68,(undefined1  [16])in[5]);
  auVar24 = pmulld(auVar44,(undefined1  [16])in[0xb]);
  auVar64 = pmulld(auVar63,(undefined1  [16])in[0xb]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1c8);
  auVar43._4_4_ = uVar1;
  auVar43._0_4_ = uVar1;
  auVar43._8_4_ = uVar1;
  auVar43._12_4_ = uVar1;
  auVar44 = pmulld(auVar43,(undefined1  [16])in[0xd]);
  auVar68 = pmulld(auVar67,(undefined1  [16])in[0xd]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x178);
  auVar70._4_4_ = uVar1;
  auVar70._0_4_ = uVar1;
  auVar70._8_4_ = uVar1;
  auVar70._12_4_ = uVar1;
  auVar49._4_4_ = iVar7;
  auVar49._0_4_ = iVar7;
  auVar49._8_4_ = iVar7;
  auVar49._12_4_ = iVar7;
  auVar19 = pmulld(auVar49,(undefined1  [16])in[3]);
  auVar21 = pmulld(auVar70,(undefined1  [16])in[3]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x250);
  auVar48._4_4_ = uVar1;
  auVar48._0_4_ = uVar1;
  auVar48._8_4_ = uVar1;
  auVar48._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x170);
  auVar69._4_4_ = uVar1;
  auVar69._0_4_ = uVar1;
  auVar69._8_4_ = uVar1;
  auVar69._12_4_ = uVar1;
  auVar23._12_4_ = uStack_1ac;
  auVar23._0_12_ = *(undefined1 (*) [12])in[2];
  auVar70 = pmulld(auVar69,auVar23);
  auVar49 = pmulld(auVar48,auVar23);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1d0);
  auVar9._4_4_ = uVar1;
  auVar9._0_4_ = uVar1;
  auVar9._8_4_ = uVar1;
  auVar9._12_4_ = uVar1;
  auVar25._4_4_ = iVar55;
  auVar25._0_4_ = iVar55;
  auVar25._8_4_ = iVar55;
  auVar25._12_4_ = iVar55;
  auVar2._12_4_ = uStack_14c;
  auVar2._0_12_ = *(undefined1 (*) [12])in[0xe];
  auVar26 = pmulld(auVar25,auVar2);
  auVar10 = pmulld(auVar9,auVar2);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x210);
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1b0);
  auVar11._4_4_ = uVar1;
  auVar11._0_4_ = uVar1;
  auVar11._8_4_ = uVar1;
  auVar11._12_4_ = uVar1;
  auVar32._12_4_ = uStack_18c;
  auVar32._0_12_ = *(undefined1 (*) [12])in[10];
  auVar12 = pmulld(auVar11,auVar32);
  auVar28 = pmulld(auVar27,auVar32);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 400);
  auVar65._4_4_ = uVar1;
  auVar65._0_4_ = uVar1;
  auVar65._8_4_ = uVar1;
  auVar65._12_4_ = uVar1;
  auVar31._4_4_ = iVar53;
  auVar31._0_4_ = iVar53;
  auVar31._8_4_ = iVar53;
  auVar31._12_4_ = iVar53;
  auVar66._12_4_ = uStack_16c;
  auVar66._0_12_ = *(undefined1 (*) [12])in[6];
  auVar32 = pmulld(auVar31,auVar66);
  auVar66 = pmulld(auVar65,auVar66);
  auVar23 = ZEXT416((uint)bit);
  iVar53 = auVar54._0_4_ + iVar3 >> auVar23;
  iVar55 = auVar54._4_4_ + iVar3 >> auVar23;
  iVar56 = auVar54._8_4_ + iVar3 >> auVar23;
  iVar57 = auVar54._12_4_ + iVar3 >> auVar23;
  iVar58 = auVar59._0_4_ + iVar3 >> auVar23;
  iVar60 = auVar59._4_4_ + iVar3 >> auVar23;
  iVar61 = auVar59._8_4_ + iVar3 >> auVar23;
  iVar62 = auVar59._12_4_ + iVar3 >> auVar23;
  iVar7 = iVar58 + iVar53;
  iVar13 = iVar60 + iVar55;
  iVar15 = iVar61 + iVar56;
  iVar17 = iVar62 + iVar57;
  iVar53 = iVar53 - iVar58;
  iVar55 = iVar55 - iVar60;
  iVar56 = iVar56 - iVar61;
  iVar57 = iVar57 - iVar62;
  uVar8 = (uint)(iVar7 < iVar5) * iVar5 | (uint)(iVar7 >= iVar5) * iVar7;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar18 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  local_138 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_134 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_130 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_12c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  uVar8 = (uint)(iVar53 < iVar5) * iVar5 | (uint)(iVar53 >= iVar5) * iVar53;
  uVar14 = (uint)(iVar55 < iVar5) * iVar5 | (uint)(iVar55 >= iVar5) * iVar55;
  uVar16 = (uint)(iVar56 < iVar5) * iVar5 | (uint)(iVar56 >= iVar5) * iVar56;
  uVar18 = (uint)(iVar57 < iVar5) * iVar5 | (uint)(iVar57 >= iVar5) * iVar57;
  local_128 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_124 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_120 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_11c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  local_388 = auVar42._0_4_;
  iStack_384 = auVar42._4_4_;
  iStack_380 = auVar42._8_4_;
  iStack_37c = auVar42._12_4_;
  iVar58 = local_388 + iVar3 >> auVar23;
  iVar60 = iStack_384 + iVar3 >> auVar23;
  iVar61 = iStack_380 + iVar3 >> auVar23;
  iVar62 = iStack_37c + iVar3 >> auVar23;
  iVar53 = auVar29._0_4_ + iVar3 >> auVar23;
  iVar55 = auVar29._4_4_ + iVar3 >> auVar23;
  iVar56 = auVar29._8_4_ + iVar3 >> auVar23;
  iVar57 = auVar29._12_4_ + iVar3 >> auVar23;
  iVar7 = iVar53 + iVar58;
  iVar13 = iVar55 + iVar60;
  iVar15 = iVar56 + iVar61;
  iVar17 = iVar57 + iVar62;
  iVar53 = iVar53 - iVar58;
  iVar55 = iVar55 - iVar60;
  iVar56 = iVar56 - iVar61;
  iVar57 = iVar57 - iVar62;
  uVar8 = (uint)(iVar7 < iVar5) * iVar5 | (uint)(iVar7 >= iVar5) * iVar7;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar18 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  local_108 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_104 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_100 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_fc = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  uVar8 = (uint)(iVar53 < iVar5) * iVar5 | (uint)(iVar53 >= iVar5) * iVar53;
  uVar14 = (uint)(iVar55 < iVar5) * iVar5 | (uint)(iVar55 >= iVar5) * iVar55;
  uVar16 = (uint)(iVar56 < iVar5) * iVar5 | (uint)(iVar56 >= iVar5) * iVar56;
  uVar18 = (uint)(iVar57 < iVar5) * iVar5 | (uint)(iVar57 >= iVar5) * iVar57;
  local_118 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_114 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_110 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_10c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  iVar33 = auVar35._0_4_ + iVar3 >> auVar23;
  iVar36 = auVar35._4_4_ + iVar3 >> auVar23;
  iVar38 = auVar35._8_4_ + iVar3 >> auVar23;
  iVar40 = auVar35._12_4_ + iVar3 >> auVar23;
  local_398 = auVar24._0_4_;
  iStack_394 = auVar24._4_4_;
  iStack_390 = auVar24._8_4_;
  iStack_38c = auVar24._12_4_;
  iVar53 = local_398 + iVar3 >> auVar23;
  iVar55 = iStack_394 + iVar3 >> auVar23;
  iVar56 = iStack_390 + iVar3 >> auVar23;
  iVar57 = iStack_38c + iVar3 >> auVar23;
  iVar7 = iVar53 + iVar33;
  iVar13 = iVar55 + iVar36;
  iVar15 = iVar56 + iVar38;
  iVar17 = iVar57 + iVar40;
  iVar33 = iVar33 - iVar53;
  iVar36 = iVar36 - iVar55;
  iVar38 = iVar38 - iVar56;
  iVar40 = iVar40 - iVar57;
  uVar8 = (uint)(iVar7 < iVar5) * iVar5 | (uint)(iVar7 >= iVar5) * iVar7;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar18 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  local_f8 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_f4 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_f0 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_ec = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  local_3a8 = auVar68._0_4_;
  iStack_3a4 = auVar68._4_4_;
  iStack_3a0 = auVar68._8_4_;
  iStack_39c = auVar68._12_4_;
  iVar58 = local_3a8 + iVar3 >> auVar23;
  iVar60 = iStack_3a4 + iVar3 >> auVar23;
  iVar61 = iStack_3a0 + iVar3 >> auVar23;
  iVar62 = iStack_39c + iVar3 >> auVar23;
  iVar53 = auVar19._0_4_ + iVar3 >> auVar23;
  iVar55 = auVar19._4_4_ + iVar3 >> auVar23;
  iVar56 = auVar19._8_4_ + iVar3 >> auVar23;
  iVar57 = auVar19._12_4_ + iVar3 >> auVar23;
  uVar8 = (uint)(iVar33 < iVar5) * iVar5 | (uint)(iVar33 >= iVar5) * iVar33;
  uVar14 = (uint)(iVar36 < iVar5) * iVar5 | (uint)(iVar36 >= iVar5) * iVar36;
  uVar16 = (uint)(iVar38 < iVar5) * iVar5 | (uint)(iVar38 >= iVar5) * iVar38;
  uVar18 = (uint)(iVar40 < iVar5) * iVar5 | (uint)(iVar40 >= iVar5) * iVar40;
  local_e8 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_e4 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_e0 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_dc = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  iVar7 = iVar53 + iVar58;
  iVar13 = iVar55 + iVar60;
  iVar15 = iVar56 + iVar61;
  iVar17 = iVar57 + iVar62;
  iVar53 = iVar53 - iVar58;
  iVar55 = iVar55 - iVar60;
  iVar56 = iVar56 - iVar61;
  iVar57 = iVar57 - iVar62;
  uVar8 = (uint)(iVar7 < iVar5) * iVar5 | (uint)(iVar7 >= iVar5) * iVar7;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar18 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  local_c8 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_c4 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_c0 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_bc = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  iVar58 = auVar44._0_4_ + iVar3 >> auVar23;
  iVar60 = auVar44._4_4_ + iVar3 >> auVar23;
  iVar61 = auVar44._8_4_ + iVar3 >> auVar23;
  iVar62 = auVar44._12_4_ + iVar3 >> auVar23;
  uVar8 = (uint)(iVar53 < iVar5) * iVar5 | (uint)(iVar53 >= iVar5) * iVar53;
  uVar14 = (uint)(iVar55 < iVar5) * iVar5 | (uint)(iVar55 >= iVar5) * iVar55;
  uVar16 = (uint)(iVar56 < iVar5) * iVar5 | (uint)(iVar56 >= iVar5) * iVar56;
  uVar18 = (uint)(iVar57 < iVar5) * iVar5 | (uint)(iVar57 >= iVar5) * iVar57;
  local_d8 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_d4 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_d0 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_cc = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  iVar53 = auVar21._0_4_ + iVar3 >> auVar23;
  iVar55 = auVar21._4_4_ + iVar3 >> auVar23;
  iVar56 = auVar21._8_4_ + iVar3 >> auVar23;
  iVar57 = auVar21._12_4_ + iVar3 >> auVar23;
  iVar7 = iVar53 + iVar58;
  iVar13 = iVar55 + iVar60;
  iVar15 = iVar56 + iVar61;
  iVar17 = iVar57 + iVar62;
  iVar53 = iVar53 - iVar58;
  iVar55 = iVar55 - iVar60;
  iVar56 = iVar56 - iVar61;
  iVar57 = iVar57 - iVar62;
  uVar8 = (uint)(iVar7 < iVar5) * iVar5 | (uint)(iVar7 >= iVar5) * iVar7;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar18 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  local_b8 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_b4 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_b0 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_ac = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  uVar8 = (uint)(iVar53 < iVar5) * iVar5 | (uint)(iVar53 >= iVar5) * iVar53;
  uVar14 = (uint)(iVar55 < iVar5) * iVar5 | (uint)(iVar55 >= iVar5) * iVar55;
  uVar16 = (uint)(iVar56 < iVar5) * iVar5 | (uint)(iVar56 >= iVar5) * iVar56;
  uVar18 = (uint)(iVar57 < iVar5) * iVar5 | (uint)(iVar57 >= iVar5) * iVar57;
  local_a8 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_a4 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_a0 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_9c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  iVar58 = auVar72._0_4_ + iVar3 >> auVar23;
  iVar60 = auVar72._4_4_ + iVar3 >> auVar23;
  iVar61 = auVar72._8_4_ + iVar3 >> auVar23;
  iVar62 = auVar72._12_4_ + iVar3 >> auVar23;
  local_368 = auVar64._0_4_;
  iStack_364 = auVar64._4_4_;
  iStack_360 = auVar64._8_4_;
  iStack_35c = auVar64._12_4_;
  iVar53 = local_368 + iVar3 >> auVar23;
  iVar55 = iStack_364 + iVar3 >> auVar23;
  iVar56 = iStack_360 + iVar3 >> auVar23;
  iVar57 = iStack_35c + iVar3 >> auVar23;
  iVar7 = iVar53 + iVar58;
  iVar13 = iVar55 + iVar60;
  iVar15 = iVar56 + iVar61;
  iVar17 = iVar57 + iVar62;
  iVar58 = iVar58 - iVar53;
  iVar60 = iVar60 - iVar55;
  iVar61 = iVar61 - iVar56;
  iVar62 = iVar62 - iVar57;
  uVar8 = (uint)(iVar7 < iVar5) * iVar5 | (uint)(iVar7 >= iVar5) * iVar7;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar18 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  local_88 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_84 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_80 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_7c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  uVar8 = (uint)(iVar58 < iVar5) * iVar5 | (uint)(iVar58 >= iVar5) * iVar58;
  uVar14 = (uint)(iVar60 < iVar5) * iVar5 | (uint)(iVar60 >= iVar5) * iVar60;
  uVar16 = (uint)(iVar61 < iVar5) * iVar5 | (uint)(iVar61 >= iVar5) * iVar61;
  uVar18 = (uint)(iVar62 < iVar5) * iVar5 | (uint)(iVar62 >= iVar5) * iVar62;
  local_98 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_94 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_90 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_8c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  local_328 = auVar22._0_4_;
  iStack_324 = auVar22._4_4_;
  iStack_320 = auVar22._8_4_;
  iStack_31c = auVar22._12_4_;
  iVar53 = local_328 + iVar3 >> auVar23;
  iVar55 = iStack_324 + iVar3 >> auVar23;
  iVar56 = iStack_320 + iVar3 >> auVar23;
  iVar57 = iStack_31c + iVar3 >> auVar23;
  local_338 = auVar47._0_4_;
  iStack_334 = auVar47._4_4_;
  iStack_330 = auVar47._8_4_;
  iStack_32c = auVar47._12_4_;
  iVar58 = local_338 + iVar3 >> auVar23;
  iVar61 = iStack_334 + iVar3 >> auVar23;
  iVar33 = iStack_330 + iVar3 >> auVar23;
  iVar38 = iStack_32c + iVar3 >> auVar23;
  iVar7 = iVar58 + iVar53;
  iVar13 = iVar61 + iVar55;
  iVar15 = iVar33 + iVar56;
  iVar17 = iVar38 + iVar57;
  iVar58 = iVar58 - iVar53;
  iVar61 = iVar61 - iVar55;
  iVar33 = iVar33 - iVar56;
  iVar38 = iVar38 - iVar57;
  local_418 = auVar20._0_4_;
  iStack_414 = auVar20._4_4_;
  iStack_410 = auVar20._8_4_;
  iStack_40c = auVar20._12_4_;
  iVar60 = local_418 + iVar3 >> auVar23;
  iVar62 = iStack_414 + iVar3 >> auVar23;
  iVar36 = iStack_410 + iVar3 >> auVar23;
  iVar40 = iStack_40c + iVar3 >> auVar23;
  local_318 = auVar30._0_4_;
  iStack_314 = auVar30._4_4_;
  iStack_310 = auVar30._8_4_;
  iStack_30c = auVar30._12_4_;
  iVar53 = local_318 + iVar3 >> auVar23;
  iVar55 = iStack_314 + iVar3 >> auVar23;
  iVar56 = iStack_310 + iVar3 >> auVar23;
  iVar57 = iStack_30c + iVar3 >> auVar23;
  iVar45 = auVar49._0_4_ + iVar3 >> auVar23;
  iVar50 = auVar49._4_4_ + iVar3 >> auVar23;
  iVar51 = auVar49._8_4_ + iVar3 >> auVar23;
  iVar52 = auVar49._12_4_ + iVar3 >> auVar23;
  uVar8 = (uint)(iVar7 < iVar5) * iVar5 | (uint)(iVar7 >= iVar5) * iVar7;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar18 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  local_78 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_74 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_70 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_6c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  local_378 = auVar26._0_4_;
  iStack_374 = auVar26._4_4_;
  iStack_370 = auVar26._8_4_;
  iStack_36c = auVar26._12_4_;
  iVar34 = local_378 + iVar3 >> auVar23;
  iVar37 = iStack_374 + iVar3 >> auVar23;
  iVar39 = iStack_370 + iVar3 >> auVar23;
  iVar41 = iStack_36c + iVar3 >> auVar23;
  uVar8 = (uint)(iVar58 < iVar5) * iVar5 | (uint)(iVar58 >= iVar5) * iVar58;
  uVar14 = (uint)(iVar61 < iVar5) * iVar5 | (uint)(iVar61 >= iVar5) * iVar61;
  uVar16 = (uint)(iVar33 < iVar5) * iVar5 | (uint)(iVar33 >= iVar5) * iVar33;
  uVar18 = (uint)(iVar38 < iVar5) * iVar5 | (uint)(iVar38 >= iVar5) * iVar38;
  local_68 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_64 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_60 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_5c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  iVar7 = iVar53 + iVar60;
  iVar13 = iVar55 + iVar62;
  iVar15 = iVar56 + iVar36;
  iVar17 = iVar57 + iVar40;
  iVar60 = iVar60 - iVar53;
  iVar62 = iVar62 - iVar55;
  iVar36 = iVar36 - iVar56;
  iVar40 = iVar40 - iVar57;
  uVar8 = (uint)(iVar7 < iVar5) * iVar5 | (uint)(iVar7 >= iVar5) * iVar7;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar18 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  local_48 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_44 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_40 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_3c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  uVar8 = (uint)(iVar60 < iVar5) * iVar5 | (uint)(iVar60 >= iVar5) * iVar60;
  uVar14 = (uint)(iVar62 < iVar5) * iVar5 | (uint)(iVar62 >= iVar5) * iVar62;
  uVar16 = (uint)(iVar36 < iVar5) * iVar5 | (uint)(iVar36 >= iVar5) * iVar36;
  uVar18 = (uint)(iVar40 < iVar5) * iVar5 | (uint)(iVar40 >= iVar5) * iVar40;
  local_58 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_54 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_50 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_4c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  auVar29._12_4_ = uStack_1ec;
  auVar29._0_12_ = *(undefined1 (*) [12])in[4];
  auVar21._4_4_ = (int)cospi8[0];
  auVar21._0_4_ = (int)cospi8[0];
  auVar21._8_4_ = (int)cospi8[0];
  auVar21._12_4_ = (int)cospi8[0];
  auVar19 = pmulld(auVar21,auVar29);
  local_1c8 = auVar19._0_4_ + iVar3 >> auVar23;
  uStack_1c4 = auVar19._4_4_ + iVar3 >> auVar23;
  uStack_1c0 = auVar19._8_4_ + iVar3 >> auVar23;
  uStack_1bc = auVar19._12_4_ + iVar3 >> auVar23;
  auVar24._4_4_ = (int)cospi56[0];
  auVar24._0_4_ = (int)cospi56[0];
  auVar24._8_4_ = (int)cospi56[0];
  auVar24._12_4_ = (int)cospi56[0];
  auVar19 = pmulld(auVar29,auVar24);
  auVar30._12_4_ = uStack_1cc;
  auVar30._0_12_ = *(undefined1 (*) [12])in[0xc];
  local_1f8 = auVar19._0_4_ + iVar3 >> auVar23;
  uStack_1f4 = auVar19._4_4_ + iVar3 >> auVar23;
  uStack_1f0 = auVar19._8_4_ + iVar3 >> auVar23;
  uStack_1ec = auVar19._12_4_ + iVar3 >> auVar23;
  auVar20._4_4_ = (int)cospim40[0];
  auVar20._0_4_ = (int)cospim40[0];
  auVar20._8_4_ = (int)cospim40[0];
  auVar20._12_4_ = (int)cospim40[0];
  auVar19 = pmulld(auVar20,auVar30);
  local_1e8 = auVar19._0_4_ + iVar3 >> auVar23;
  uStack_1e4 = auVar19._4_4_ + iVar3 >> auVar23;
  uStack_1e0 = auVar19._8_4_ + iVar3 >> auVar23;
  uStack_1dc = auVar19._12_4_ + iVar3 >> auVar23;
  auVar22._4_4_ = (int)cospi24[0];
  auVar22._0_4_ = (int)cospi24[0];
  auVar22._8_4_ = (int)cospi24[0];
  auVar22._12_4_ = (int)cospi24[0];
  auVar19 = pmulld(auVar30,auVar22);
  local_1d8 = auVar19._0_4_ + iVar3 >> auVar23;
  uStack_1d4 = auVar19._4_4_ + iVar3 >> auVar23;
  uStack_1d0 = auVar19._8_4_ + iVar3 >> auVar23;
  uStack_1cc = auVar19._12_4_ + iVar3 >> auVar23;
  iVar7 = iVar34 + iVar45;
  iVar13 = iVar37 + iVar50;
  iVar15 = iVar39 + iVar51;
  iVar17 = iVar41 + iVar52;
  iVar45 = iVar45 - iVar34;
  iVar50 = iVar50 - iVar37;
  iVar51 = iVar51 - iVar39;
  iVar52 = iVar52 - iVar41;
  uVar8 = (uint)(iVar7 < iVar5) * iVar5 | (uint)(iVar7 >= iVar5) * iVar7;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar18 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  local_1b8 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_1b4 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_1b0 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_1ac = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  local_358 = auVar28._0_4_;
  iStack_354 = auVar28._4_4_;
  iStack_350 = auVar28._8_4_;
  iStack_34c = auVar28._12_4_;
  iVar53 = local_358 + iVar3 >> auVar23;
  iVar55 = iStack_354 + iVar3 >> auVar23;
  iVar56 = iStack_350 + iVar3 >> auVar23;
  iVar57 = iStack_34c + iVar3 >> auVar23;
  iVar58 = auVar32._0_4_ + iVar3 >> auVar23;
  iVar60 = auVar32._4_4_ + iVar3 >> auVar23;
  iVar61 = auVar32._8_4_ + iVar3 >> auVar23;
  iVar62 = auVar32._12_4_ + iVar3 >> auVar23;
  uVar8 = (uint)(iVar45 < iVar5) * iVar5 | (uint)(iVar45 >= iVar5) * iVar45;
  uVar14 = (uint)(iVar50 < iVar5) * iVar5 | (uint)(iVar50 >= iVar5) * iVar50;
  uVar16 = (uint)(iVar51 < iVar5) * iVar5 | (uint)(iVar51 >= iVar5) * iVar51;
  uVar18 = (uint)(iVar52 < iVar5) * iVar5 | (uint)(iVar52 >= iVar5) * iVar52;
  local_1a8 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_1a4 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_1a0 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_19c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  iVar7 = iVar58 + iVar53;
  iVar13 = iVar60 + iVar55;
  iVar15 = iVar61 + iVar56;
  iVar17 = iVar62 + iVar57;
  iVar58 = iVar58 - iVar53;
  iVar60 = iVar60 - iVar55;
  iVar61 = iVar61 - iVar56;
  iVar62 = iVar62 - iVar57;
  local_348 = auVar12._0_4_;
  iStack_344 = auVar12._4_4_;
  iStack_340 = auVar12._8_4_;
  iStack_33c = auVar12._12_4_;
  iVar53 = local_348 + iVar3 >> auVar23;
  iVar55 = iStack_344 + iVar3 >> auVar23;
  iVar56 = iStack_340 + iVar3 >> auVar23;
  iVar57 = iStack_33c + iVar3 >> auVar23;
  iVar33 = auVar66._0_4_ + iVar3 >> auVar23;
  iVar36 = auVar66._4_4_ + iVar3 >> auVar23;
  iVar38 = auVar66._8_4_ + iVar3 >> auVar23;
  iVar40 = auVar66._12_4_ + iVar3 >> auVar23;
  uVar8 = (uint)(iVar7 < iVar5) * iVar5 | (uint)(iVar7 >= iVar5) * iVar7;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar18 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  local_188 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_184 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_180 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_17c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  uVar8 = (uint)(iVar58 < iVar5) * iVar5 | (uint)(iVar58 >= iVar5) * iVar58;
  uVar14 = (uint)(iVar60 < iVar5) * iVar5 | (uint)(iVar60 >= iVar5) * iVar60;
  uVar16 = (uint)(iVar61 < iVar5) * iVar5 | (uint)(iVar61 >= iVar5) * iVar61;
  uVar18 = (uint)(iVar62 < iVar5) * iVar5 | (uint)(iVar62 >= iVar5) * iVar62;
  local_198 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_194 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_190 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_18c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  iVar7 = iVar33 + iVar53;
  iVar13 = iVar36 + iVar55;
  iVar15 = iVar38 + iVar56;
  iVar17 = iVar40 + iVar57;
  iVar33 = iVar33 - iVar53;
  iVar36 = iVar36 - iVar55;
  iVar38 = iVar38 - iVar56;
  iVar40 = iVar40 - iVar57;
  iVar58 = auVar70._0_4_ + iVar3 >> auVar23;
  iVar60 = auVar70._4_4_ + iVar3 >> auVar23;
  iVar61 = auVar70._8_4_ + iVar3 >> auVar23;
  iVar62 = auVar70._12_4_ + iVar3 >> auVar23;
  uVar8 = (uint)(iVar7 < iVar5) * iVar5 | (uint)(iVar7 >= iVar5) * iVar7;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar18 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  local_178 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_174 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_170 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_16c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  local_428 = auVar10._0_4_;
  iStack_424 = auVar10._4_4_;
  iStack_420 = auVar10._8_4_;
  iStack_41c = auVar10._12_4_;
  iVar53 = local_428 + iVar3 >> auVar23;
  iVar55 = iStack_424 + iVar3 >> auVar23;
  iVar56 = iStack_420 + iVar3 >> auVar23;
  iVar57 = iStack_41c + iVar3 >> auVar23;
  uVar8 = (uint)(iVar33 < iVar5) * iVar5 | (uint)(iVar33 >= iVar5) * iVar33;
  uVar14 = (uint)(iVar36 < iVar5) * iVar5 | (uint)(iVar36 >= iVar5) * iVar36;
  uVar16 = (uint)(iVar38 < iVar5) * iVar5 | (uint)(iVar38 >= iVar5) * iVar38;
  uVar18 = (uint)(iVar40 < iVar5) * iVar5 | (uint)(iVar40 >= iVar5) * iVar40;
  local_168 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_164 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_160 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_15c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  iVar7 = iVar53 + iVar58;
  iVar13 = iVar55 + iVar60;
  iVar15 = iVar56 + iVar61;
  iVar17 = iVar57 + iVar62;
  iVar58 = iVar58 - iVar53;
  iVar60 = iVar60 - iVar55;
  iVar61 = iVar61 - iVar56;
  iVar62 = iVar62 - iVar57;
  uVar8 = (uint)(iVar7 < iVar5) * iVar5 | (uint)(iVar7 >= iVar5) * iVar7;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar18 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  local_148 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_144 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_140 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_13c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  uVar8 = (uint)(iVar58 < iVar5) * iVar5 | (uint)(iVar58 >= iVar5) * iVar58;
  uVar14 = (uint)(iVar60 < iVar5) * iVar5 | (uint)(iVar60 >= iVar5) * iVar60;
  uVar16 = (uint)(iVar61 < iVar5) * iVar5 | (uint)(iVar61 >= iVar5) * iVar61;
  uVar18 = (uint)(iVar62 < iVar5) * iVar5 | (uint)(iVar62 >= iVar5) * iVar62;
  local_158 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_154 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_150 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_14c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  cospi32[0]._4_4_ = (int)cospi32[0];
  cospi32[1]._0_4_ = (int)cospi32[0];
  cospi32[1]._4_4_ = (int)cospi32[0];
  cospi16[0]._4_4_ = (int)cospi16[0];
  cospi16[1]._0_4_ = (int)cospi16[0];
  cospi16[1]._4_4_ = (int)cospi16[0];
  cospim48[0]._4_4_ = (int)cospim48[0];
  cospim48[1]._0_4_ = (int)cospim48[0];
  cospim48[1]._4_4_ = (int)cospim48[0];
  cospi48[0]._4_4_ = (int)cospi48[0];
  cospi48[1]._0_4_ = (int)cospi48[0];
  cospi48[1]._4_4_ = (int)cospi48[0];
  clamp_lo[0]._0_4_ = iVar5;
  clamp_lo[0]._4_4_ = iVar5;
  clamp_lo[1]._0_4_ = iVar5;
  clamp_lo[1]._4_4_ = iVar5;
  cospim16[0]._4_4_ = (int)cospim16[0];
  cospim16[1]._0_4_ = (int)cospim16[0];
  cospim16[1]._4_4_ = (int)cospim16[0];
  cospim32[0]._4_4_ = (int)cospim32[0];
  cospim32[1]._0_4_ = (int)cospim32[0];
  cospim32[1]._4_4_ = (int)cospim32[0];
  cospim24[0]._4_4_ = (int)cospim24[0];
  cospim24[1]._0_4_ = (int)cospim24[0];
  cospim24[1]._4_4_ = (int)cospim24[0];
  cospim56[0]._4_4_ = (int)cospim56[0];
  cospim56[1]._0_4_ = (int)cospim56[0];
  cospim56[1]._4_4_ = (int)cospim56[0];
  cospim8[0]._4_4_ = (int)cospim8[0];
  cospim8[1]._0_4_ = (int)cospim8[0];
  cospim8[1]._4_4_ = (int)cospim8[0];
  cospi40[0]._4_4_ = (int)cospi40[0];
  cospi40[1]._0_4_ = (int)cospi40[0];
  cospi40[1]._4_4_ = (int)cospi40[0];
  clamp_hi[0]._0_4_ = iVar6;
  clamp_hi[0]._4_4_ = iVar6;
  clamp_hi[1]._0_4_ = iVar6;
  clamp_hi[1]._4_4_ = iVar6;
  rounding[0]._0_4_ = iVar3;
  rounding[0]._4_4_ = iVar3;
  rounding[1]._0_4_ = iVar3;
  rounding[1]._4_4_ = iVar3;
  cospim40[0]._4_4_ = (int)cospim40[0];
  cospim40[1]._0_4_ = (int)cospim40[0];
  cospim40[1]._4_4_ = (int)cospim40[0];
  cospi8[0]._4_4_ = (int)cospi8[0];
  cospi8[1]._0_4_ = (int)cospi8[0];
  cospi8[1]._4_4_ = (int)cospi8[0];
  cospi24[0]._4_4_ = (int)cospi24[0];
  cospi24[1]._0_4_ = (int)cospi24[0];
  cospi24[1]._4_4_ = (int)cospi24[0];
  cospi56[0]._4_4_ = (int)cospi56[0];
  cospi56[1]._0_4_ = (int)cospi56[0];
  cospi56[1]._4_4_ = (int)cospi56[0];
  idct32_stage4_sse4_1
            ((__m128i *)&local_238,&cospim8,&cospi56,&cospi8,&cospim56,&cospim40,&cospi24,&cospi40,
             &cospim24,&rounding,bit);
  auVar26._4_4_ = uStack_234;
  auVar26._0_4_ = local_238;
  auVar26._8_4_ = uStack_230;
  auVar26._12_4_ = uStack_22c;
  auVar28._4_4_ = uStack_214;
  auVar28._0_4_ = local_218;
  auVar28._8_4_ = uStack_210;
  auVar28._12_4_ = uStack_20c;
  auVar10._4_4_ = cospi32[0]._4_4_;
  auVar10._0_4_ = (int)cospi32[0];
  auVar10._8_4_ = (int)cospi32[1];
  auVar10._12_4_ = cospi32[1]._4_4_;
  auVar10 = pmulld(auVar26,auVar10);
  local_238 = auVar10._0_4_ + iVar3 >> auVar23;
  uStack_234 = auVar10._4_4_ + iVar3 >> auVar23;
  uStack_230 = auVar10._8_4_ + iVar3 >> auVar23;
  uStack_22c = auVar10._12_4_ + iVar3 >> auVar23;
  auVar12._4_4_ = cospi16[0]._4_4_;
  auVar12._0_4_ = (int)cospi16[0];
  auVar12._8_4_ = (int)cospi16[1];
  auVar12._12_4_ = cospi16[1]._4_4_;
  auVar10 = pmulld(auVar12,auVar28);
  local_208 = auVar10._0_4_ + iVar3 >> auVar23;
  uStack_204 = auVar10._4_4_ + iVar3 >> auVar23;
  uStack_200 = auVar10._8_4_ + iVar3 >> auVar23;
  uStack_1fc = auVar10._12_4_ + iVar3 >> auVar23;
  auVar19._4_4_ = cospi48[0]._4_4_;
  auVar19._0_4_ = (int)cospi48[0];
  auVar19._8_4_ = (int)cospi48[1];
  auVar19._12_4_ = cospi48[1]._4_4_;
  auVar10 = pmulld(auVar28,auVar19);
  local_218 = auVar10._0_4_ + iVar3 >> auVar23;
  uStack_214 = auVar10._4_4_ + iVar3 >> auVar23;
  uStack_210 = auVar10._8_4_ + iVar3 >> auVar23;
  uStack_20c = auVar10._12_4_ + iVar3 >> auVar23;
  iVar53 = local_1e8 + local_1f8;
  iVar55 = uStack_1e4 + uStack_1f4;
  iVar3 = uStack_1e0 + uStack_1f0;
  iVar56 = uStack_1dc + uStack_1ec;
  iVar7 = local_1f8 - local_1e8;
  iVar13 = uStack_1f4 - uStack_1e4;
  iVar15 = uStack_1f0 - uStack_1e0;
  iVar17 = uStack_1ec - uStack_1dc;
  uVar8 = (uint)(iVar53 < iVar5) * iVar5 | (uint)(iVar53 >= iVar5) * iVar53;
  uVar14 = (uint)(iVar55 < iVar5) * iVar5 | (uint)(iVar55 >= iVar5) * iVar55;
  uVar16 = (uint)(iVar3 < iVar5) * iVar5 | (uint)(iVar3 >= iVar5) * iVar3;
  uVar18 = (uint)(iVar56 < iVar5) * iVar5 | (uint)(iVar56 >= iVar5) * iVar56;
  local_1f8 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_1f4 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_1f0 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_1ec = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  uVar8 = (uint)(iVar7 < iVar5) * iVar5 | (uint)(iVar7 >= iVar5) * iVar7;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar18 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  local_1e8 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_1e4 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_1e0 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_1dc = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  iVar53 = local_1d8 + local_1c8;
  iVar55 = uStack_1d4 + uStack_1c4;
  iVar3 = uStack_1d0 + uStack_1c0;
  iVar56 = uStack_1cc + uStack_1bc;
  iVar7 = local_1c8 - local_1d8;
  iVar13 = uStack_1c4 - uStack_1d4;
  iVar15 = uStack_1c0 - uStack_1d0;
  iVar17 = uStack_1bc - uStack_1cc;
  uVar8 = (uint)(iVar53 < iVar5) * iVar5 | (uint)(iVar53 >= iVar5) * iVar53;
  uVar14 = (uint)(iVar55 < iVar5) * iVar5 | (uint)(iVar55 >= iVar5) * iVar55;
  uVar16 = (uint)(iVar3 < iVar5) * iVar5 | (uint)(iVar3 >= iVar5) * iVar3;
  uVar18 = (uint)(iVar56 < iVar5) * iVar5 | (uint)(iVar56 >= iVar5) * iVar56;
  local_1c8 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_1c4 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_1c0 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_1bc = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  uVar8 = (uint)(iVar7 < iVar5) * iVar5 | (uint)(iVar7 >= iVar5) * iVar7;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar18 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  local_1d8 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_1d4 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_1d0 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_1cc = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  local_228 = local_238;
  uStack_224 = uStack_234;
  uStack_220 = uStack_230;
  uStack_21c = uStack_22c;
  idct32_stage5_sse4_1
            ((__m128i *)&local_238,&cospim16,&cospi48,&cospi16,&cospim48,&clamp_lo,&clamp_hi,
             &rounding,bit);
  iVar53 = local_208 + local_238;
  iVar55 = uStack_204 + uStack_234;
  iVar3 = uStack_200 + uStack_230;
  iVar56 = uStack_1fc + uStack_22c;
  iVar7 = local_238 - local_208;
  iVar13 = uStack_234 - uStack_204;
  iVar15 = uStack_230 - uStack_200;
  iVar17 = uStack_22c - uStack_1fc;
  uVar8 = (uint)(iVar53 < iVar5) * iVar5 | (uint)(iVar53 >= iVar5) * iVar53;
  uVar14 = (uint)(iVar55 < iVar5) * iVar5 | (uint)(iVar55 >= iVar5) * iVar55;
  uVar16 = (uint)(iVar3 < iVar5) * iVar5 | (uint)(iVar3 >= iVar5) * iVar3;
  uVar18 = (uint)(iVar56 < iVar5) * iVar5 | (uint)(iVar56 >= iVar5) * iVar56;
  local_238 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_234 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_230 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_22c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  uVar8 = (uint)(iVar7 < iVar5) * iVar5 | (uint)(iVar7 >= iVar5) * iVar7;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar18 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  local_208 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_204 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_200 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_1fc = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  iVar7 = local_218 + local_228;
  iVar13 = uStack_214 + uStack_224;
  iVar15 = uStack_210 + uStack_220;
  iVar17 = uStack_20c + uStack_21c;
  iVar53 = local_228 - local_218;
  iVar55 = uStack_224 - uStack_214;
  iVar3 = uStack_220 - uStack_210;
  iVar56 = uStack_21c - uStack_20c;
  uVar8 = (uint)(iVar7 < iVar5) * iVar5 | (uint)(iVar7 >= iVar5) * iVar7;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar18 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  local_228 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_224 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_220 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_21c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  uVar8 = (uint)(iVar53 < iVar5) * iVar5 | (uint)(iVar53 >= iVar5) * iVar53;
  uVar14 = (uint)(iVar55 < iVar5) * iVar5 | (uint)(iVar55 >= iVar5) * iVar55;
  uVar16 = (uint)(iVar3 < iVar5) * iVar5 | (uint)(iVar3 >= iVar5) * iVar3;
  uVar18 = (uint)(iVar56 < iVar5) * iVar5 | (uint)(iVar56 >= iVar5) * iVar56;
  local_218 = (uint)(iVar6 < (int)uVar8) * iVar6 | (iVar6 >= (int)uVar8) * uVar8;
  uStack_214 = (uint)(iVar6 < (int)uVar14) * iVar6 | (iVar6 >= (int)uVar14) * uVar14;
  uStack_210 = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
  uStack_20c = (uint)(iVar6 < (int)uVar18) * iVar6 | (iVar6 >= (int)uVar18) * uVar18;
  idct32_stage6_sse4_1
            ((__m128i *)&local_238,&cospim32,&cospi32,&cospim16,&cospi48,&cospi16,&cospim48,
             &clamp_lo,&clamp_hi,&rounding,bit);
  idct32_stage7_sse4_1((__m128i *)&local_238,&cospim32,&cospi32,&clamp_lo,&clamp_hi,&rounding,bit);
  idct32_stage8_sse4_1((__m128i *)&local_238,&cospim32,&cospi32,&clamp_lo,&clamp_hi,&rounding,bit);
  idct32_stage9_sse4_1((__m128i *)&local_238,out,do_cols,bd,out_shift,&clamp_lo,&clamp_hi);
  return;
}

Assistant:

static void idct32x32_low16_sse4_1(__m128i *in, __m128i *out, int bit,
                                   int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi30 = _mm_set1_epi32(cospi[30]);
  const __m128i cospi46 = _mm_set1_epi32(cospi[46]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospi22 = _mm_set1_epi32(cospi[22]);
  const __m128i cospi38 = _mm_set1_epi32(cospi[38]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi26 = _mm_set1_epi32(cospi[26]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi18 = _mm_set1_epi32(cospi[18]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i cospim42 = _mm_set1_epi32(-cospi[42]);
  const __m128i cospim50 = _mm_set1_epi32(-cospi[50]);
  const __m128i cospim34 = _mm_set1_epi32(-cospi[34]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i rounding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i bf1[32];

  // stage 0
  // stage 1

  bf1[0] = in[0];
  bf1[2] = in[8];
  bf1[4] = in[4];
  bf1[6] = in[12];
  bf1[8] = in[2];
  bf1[10] = in[10];
  bf1[12] = in[6];
  bf1[14] = in[14];
  bf1[16] = in[1];
  bf1[18] = in[9];
  bf1[20] = in[5];
  bf1[22] = in[13];
  bf1[24] = in[3];
  bf1[26] = in[11];
  bf1[28] = in[7];
  bf1[30] = in[15];

  // stage 2
  bf1[31] = half_btf_0_sse4_1(&cospi2, &bf1[16], &rounding, bit);
  bf1[16] = half_btf_0_sse4_1(&cospi62, &bf1[16], &rounding, bit);
  bf1[17] = half_btf_0_sse4_1(&cospim34, &bf1[30], &rounding, bit);
  bf1[30] = half_btf_0_sse4_1(&cospi30, &bf1[30], &rounding, bit);
  bf1[29] = half_btf_0_sse4_1(&cospi18, &bf1[18], &rounding, bit);
  bf1[18] = half_btf_0_sse4_1(&cospi46, &bf1[18], &rounding, bit);
  bf1[19] = half_btf_0_sse4_1(&cospim50, &bf1[28], &rounding, bit);
  bf1[28] = half_btf_0_sse4_1(&cospi14, &bf1[28], &rounding, bit);
  bf1[27] = half_btf_0_sse4_1(&cospi10, &bf1[20], &rounding, bit);
  bf1[20] = half_btf_0_sse4_1(&cospi54, &bf1[20], &rounding, bit);
  bf1[21] = half_btf_0_sse4_1(&cospim42, &bf1[26], &rounding, bit);
  bf1[26] = half_btf_0_sse4_1(&cospi22, &bf1[26], &rounding, bit);
  bf1[25] = half_btf_0_sse4_1(&cospi26, &bf1[22], &rounding, bit);
  bf1[22] = half_btf_0_sse4_1(&cospi38, &bf1[22], &rounding, bit);
  bf1[23] = half_btf_0_sse4_1(&cospim58, &bf1[24], &rounding, bit);
  bf1[24] = half_btf_0_sse4_1(&cospi6, &bf1[24], &rounding, bit);

  // stage 3
  bf1[15] = half_btf_0_sse4_1(&cospi4, &bf1[8], &rounding, bit);
  bf1[8] = half_btf_0_sse4_1(&cospi60, &bf1[8], &rounding, bit);
  bf1[9] = half_btf_0_sse4_1(&cospim36, &bf1[14], &rounding, bit);
  bf1[14] = half_btf_0_sse4_1(&cospi28, &bf1[14], &rounding, bit);
  bf1[13] = half_btf_0_sse4_1(&cospi20, &bf1[10], &rounding, bit);
  bf1[10] = half_btf_0_sse4_1(&cospi44, &bf1[10], &rounding, bit);
  bf1[11] = half_btf_0_sse4_1(&cospim52, &bf1[12], &rounding, bit);
  bf1[12] = half_btf_0_sse4_1(&cospi12, &bf1[12], &rounding, bit);

  addsub_sse4_1(bf1[16], bf1[17], bf1 + 16, bf1 + 17, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[19], bf1[18], bf1 + 19, bf1 + 18, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[20], bf1[21], bf1 + 20, bf1 + 21, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[23], bf1[22], bf1 + 23, bf1 + 22, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[24], bf1[25], bf1 + 24, bf1 + 25, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[27], bf1[26], bf1 + 27, bf1 + 26, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[28], bf1[29], bf1 + 28, bf1 + 29, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[31], bf1[30], bf1 + 31, bf1 + 30, &clamp_lo, &clamp_hi);
  // stage 4
  bf1[7] = half_btf_0_sse4_1(&cospi8, &bf1[4], &rounding, bit);
  bf1[4] = half_btf_0_sse4_1(&cospi56, &bf1[4], &rounding, bit);
  bf1[5] = half_btf_0_sse4_1(&cospim40, &bf1[6], &rounding, bit);
  bf1[6] = half_btf_0_sse4_1(&cospi24, &bf1[6], &rounding, bit);

  addsub_sse4_1(bf1[8], bf1[9], bf1 + 8, bf1 + 9, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[11], bf1[10], bf1 + 11, bf1 + 10, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[12], bf1[13], bf1 + 12, bf1 + 13, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[15], bf1[14], bf1 + 15, bf1 + 14, &clamp_lo, &clamp_hi);

  idct32_stage4_sse4_1(bf1, &cospim8, &cospi56, &cospi8, &cospim56, &cospim40,
                       &cospi24, &cospi40, &cospim24, &rounding, bit);

  // stage 5
  bf1[0] = half_btf_0_sse4_1(&cospi32, &bf1[0], &rounding, bit);
  bf1[1] = bf1[0];
  bf1[3] = half_btf_0_sse4_1(&cospi16, &bf1[2], &rounding, bit);
  bf1[2] = half_btf_0_sse4_1(&cospi48, &bf1[2], &rounding, bit);

  addsub_sse4_1(bf1[4], bf1[5], bf1 + 4, bf1 + 5, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[7], bf1[6], bf1 + 7, bf1 + 6, &clamp_lo, &clamp_hi);

  idct32_stage5_sse4_1(bf1, &cospim16, &cospi48, &cospi16, &cospim48, &clamp_lo,
                       &clamp_hi, &rounding, bit);

  // stage 6
  addsub_sse4_1(bf1[0], bf1[3], bf1 + 0, bf1 + 3, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[1], bf1[2], bf1 + 1, bf1 + 2, &clamp_lo, &clamp_hi);

  idct32_stage6_sse4_1(bf1, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rounding, bit);

  // stage 7
  idct32_stage7_sse4_1(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

  // stage 8
  idct32_stage8_sse4_1(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);
  // stage 9
  idct32_stage9_sse4_1(bf1, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
}